

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse41_128_8.c
# Opt level: O2

parasail_result_t *
parasail_nw_table_striped_profile_sse41_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  byte *pbVar1;
  undefined1 (*pauVar2) [16];
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  bool bVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  undefined1 auVar22 [16];
  uint uVar23;
  int iVar24;
  int iVar25;
  parasail_result_t *ppVar26;
  __m128i *palVar27;
  __m128i *ptr;
  int8_t *ptr_00;
  int8_t iVar28;
  char *pcVar29;
  long lVar30;
  int iVar31;
  ulong uVar32;
  uint uVar33;
  char *__format;
  ulong uVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  ulong size;
  __m128i *ptr_01;
  long lVar38;
  byte bVar39;
  byte bVar42;
  byte bVar43;
  byte bVar44;
  byte bVar45;
  byte bVar46;
  byte bVar47;
  byte bVar48;
  byte bVar49;
  byte bVar50;
  byte bVar51;
  byte bVar52;
  byte bVar53;
  byte bVar54;
  byte bVar55;
  byte bVar56;
  undefined1 auVar40 [16];
  __m128i alVar41;
  char cVar57;
  ulong uVar58;
  char cVar64;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  char cVar65;
  undefined1 auVar63 [16];
  byte bVar66;
  byte bVar67;
  byte bVar68;
  byte bVar69;
  byte bVar70;
  byte bVar71;
  byte bVar72;
  byte bVar73;
  byte bVar74;
  byte bVar75;
  byte bVar76;
  byte bVar77;
  byte bVar78;
  byte bVar79;
  byte bVar80;
  byte bVar81;
  byte bVar82;
  byte bVar83;
  byte bVar84;
  byte bVar85;
  byte bVar86;
  byte bVar87;
  byte bVar88;
  byte bVar89;
  byte bVar90;
  byte bVar91;
  byte bVar92;
  byte bVar93;
  byte bVar94;
  byte bVar95;
  byte bVar96;
  byte bVar97;
  char cVar99;
  char cVar100;
  char cVar101;
  char cVar102;
  char cVar103;
  char cVar104;
  char cVar105;
  char cVar106;
  char cVar107;
  char cVar108;
  char cVar109;
  char cVar110;
  char cVar111;
  char cVar112;
  undefined1 auVar98 [16];
  char cVar113;
  __m128i vH;
  __m128i vH_00;
  int32_t in_stack_fffffffffffffe98;
  __m128i *local_150;
  byte local_d8;
  byte bStack_d7;
  byte bStack_d6;
  byte bStack_d5;
  byte bStack_d4;
  byte bStack_d3;
  byte bStack_d2;
  byte bStack_d1;
  byte bStack_d0;
  byte bStack_cf;
  byte bStack_ce;
  byte bStack_cd;
  byte bStack_cc;
  byte bStack_cb;
  byte bStack_ca;
  byte bStack_c9;
  byte local_98;
  byte bStack_97;
  byte bStack_96;
  byte bStack_95;
  byte bStack_94;
  byte bStack_93;
  byte bStack_92;
  byte bStack_91;
  byte bStack_90;
  byte bStack_8f;
  byte bStack_8e;
  byte bStack_8d;
  byte bStack_8c;
  byte bStack_8b;
  byte bStack_8a;
  byte bStack_89;
  __m128i_8_t e;
  __m128i_8_t h;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar29 = "profile";
  }
  else {
    pvVar4 = (profile->profile8).score;
    if (pvVar4 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar29 = "profile->profile8.score";
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar29 = "profile->matrix";
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar29 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar29 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar29 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar29 = "open";
        }
        else {
          if (-1 < gap) {
            uVar33 = uVar3 - 1;
            size = (ulong)uVar3 + 0xf >> 4;
            iVar31 = -open;
            iVar25 = ppVar5->min;
            uVar23 = (uint)(byte)-(char)iVar25;
            if (iVar25 != iVar31 && SBORROW4(iVar25,iVar31) == iVar25 + open < 0) {
              uVar23 = open;
            }
            iVar25 = ppVar5->max;
            ppVar26 = parasail_result_new_table1((uint)((ulong)uVar3 + 0xf) & 0x7ffffff0,s2Len);
            if (ppVar26 != (parasail_result_t *)0x0) {
              ppVar26->flag = ppVar26->flag | 0x10120801;
              palVar27 = parasail_memalign___m128i(0x10,size);
              local_150 = parasail_memalign___m128i(0x10,size);
              ptr = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign_int8_t(0x10,(ulong)(s2Len + 1));
              if ((ptr_00 != (int8_t *)0x0 && ptr != (__m128i *)0x0) &&
                  (local_150 != (__m128i *)0x0 && palVar27 != (__m128i *)0x0)) {
                iVar24 = s2Len + -1;
                auVar59 = pshufb(ZEXT416((uint)open),(undefined1  [16])0x0);
                auVar60 = pshufb(ZEXT416((uint)gap),(undefined1  [16])0x0);
                auVar61 = pshufb(ZEXT116((byte)((char)uVar23 + 0x81)),(undefined1  [16])0x0);
                auVar62 = pshufb(ZEXT116((byte)(0x7e - (char)iVar25)),(undefined1  [16])0x0);
                lVar30 = (long)iVar31;
                for (uVar34 = 0; uVar34 != size; uVar34 = uVar34 + 1) {
                  lVar35 = lVar30;
                  for (lVar36 = 0; lVar36 != 0x10; lVar36 = lVar36 + 1) {
                    lVar37 = -0x80;
                    if (-0x80 < lVar35) {
                      lVar37 = lVar35;
                    }
                    lVar38 = lVar35 - (ulong)(uint)open;
                    if ((long)(lVar35 - (ulong)(uint)open) < -0x7f) {
                      lVar38 = -0x80;
                    }
                    h.v[lVar36] = (int8_t)lVar37;
                    e.v[lVar36] = (int8_t)lVar38;
                    lVar35 = lVar35 - size * (uint)gap;
                  }
                  palVar27[uVar34][0] = h.m[0];
                  palVar27[uVar34][1] = h.m[1];
                  ptr[uVar34][0] = e.m[0];
                  ptr[uVar34][1] = e.m[1];
                  lVar30 = lVar30 - (ulong)(uint)gap;
                }
                *ptr_00 = '\0';
                for (uVar34 = 1; s2Len + 1 != uVar34; uVar34 = uVar34 + 1) {
                  iVar28 = -0x80;
                  if (-0x80 < iVar31) {
                    iVar28 = (int8_t)iVar31;
                  }
                  ptr_00[uVar34] = iVar28;
                  iVar31 = iVar31 - gap;
                }
                iVar25 = (int)size;
                uVar34 = 0;
                local_98 = auVar62[0];
                bStack_97 = auVar62[1];
                bStack_96 = auVar62[2];
                bStack_95 = auVar62[3];
                bStack_94 = auVar62[4];
                bStack_93 = auVar62[5];
                bStack_92 = auVar62[6];
                bStack_91 = auVar62[7];
                bStack_90 = auVar62[8];
                bStack_8f = auVar62[9];
                bStack_8e = auVar62[10];
                bStack_8d = auVar62[0xb];
                bStack_8c = auVar62[0xc];
                bStack_8b = auVar62[0xd];
                bStack_8a = auVar62[0xe];
                bStack_89 = auVar62[0xf];
                local_d8 = auVar61[0];
                bStack_d7 = auVar61[1];
                bStack_d6 = auVar61[2];
                bStack_d5 = auVar61[3];
                bStack_d4 = auVar61[4];
                bStack_d3 = auVar61[5];
                bStack_d2 = auVar61[6];
                bStack_d1 = auVar61[7];
                bStack_d0 = auVar61[8];
                bStack_cf = auVar61[9];
                bStack_ce = auVar61[10];
                bStack_cd = auVar61[0xb];
                bStack_cc = auVar61[0xc];
                bStack_cb = auVar61[0xd];
                bStack_ca = auVar61[0xe];
                bStack_c9 = auVar61[0xf];
                bVar66 = local_d8;
                bVar67 = bStack_d7;
                bVar68 = bStack_d6;
                bVar69 = bStack_d5;
                bVar70 = bStack_d4;
                bVar71 = bStack_d3;
                bVar72 = bStack_d2;
                bVar73 = bStack_d1;
                bVar74 = bStack_d0;
                bVar75 = bStack_cf;
                bVar76 = bStack_ce;
                bVar77 = bStack_cd;
                bVar78 = bStack_cc;
                bVar79 = bStack_cb;
                bVar80 = bStack_ca;
                bVar81 = bStack_c9;
                bVar82 = local_98;
                bVar83 = bStack_97;
                bVar84 = bStack_96;
                bVar85 = bStack_95;
                bVar86 = bStack_94;
                bVar87 = bStack_93;
                bVar88 = bStack_92;
                bVar89 = bStack_91;
                bVar90 = bStack_90;
                bVar91 = bStack_8f;
                bVar92 = bStack_8e;
                bVar93 = bStack_8d;
                bVar94 = bStack_8c;
                bVar95 = bStack_8b;
                bVar96 = bStack_8a;
                bVar97 = bStack_89;
                do {
                  ptr_01 = palVar27;
                  if (uVar34 == (uint)s2Len) {
                    alVar41 = ptr_01[(ulong)uVar33 % size];
                    iVar25 = 0;
                    while( true ) {
                      uVar34 = alVar41[0];
                      lVar30 = alVar41[1];
                      if (0xf - (int)(uVar33 / size) <= iVar25) break;
                      alVar41[0] = uVar34 << 8;
                      alVar41[1] = lVar30 << 8 | uVar34 >> 0x38;
                      iVar25 = iVar25 + 1;
                    }
                    auVar59[0] = -((char)bVar82 < (char)local_d8);
                    auVar59[1] = -((char)bVar83 < (char)bStack_d7);
                    auVar59[2] = -((char)bVar84 < (char)bStack_d6);
                    auVar59[3] = -((char)bVar85 < (char)bStack_d5);
                    auVar59[4] = -((char)bVar86 < (char)bStack_d4);
                    auVar59[5] = -((char)bVar87 < (char)bStack_d3);
                    auVar59[6] = -((char)bVar88 < (char)bStack_d2);
                    auVar59[7] = -((char)bVar89 < (char)bStack_d1);
                    auVar59[8] = -((char)bVar90 < (char)bStack_d0);
                    auVar59[9] = -((char)bVar91 < (char)bStack_cf);
                    auVar59[10] = -((char)bVar92 < (char)bStack_ce);
                    auVar59[0xb] = -((char)bVar93 < (char)bStack_cd);
                    auVar59[0xc] = -((char)bVar94 < (char)bStack_cc);
                    auVar59[0xd] = -((char)bVar95 < (char)bStack_cb);
                    auVar59[0xe] = -((char)bVar96 < (char)bStack_ca);
                    auVar59[0xf] = -((char)bVar97 < (char)bStack_c9);
                    auVar60[0] = -((char)local_98 < (char)bVar66);
                    auVar60[1] = -((char)bStack_97 < (char)bVar67);
                    auVar60[2] = -((char)bStack_96 < (char)bVar68);
                    auVar60[3] = -((char)bStack_95 < (char)bVar69);
                    auVar60[4] = -((char)bStack_94 < (char)bVar70);
                    auVar60[5] = -((char)bStack_93 < (char)bVar71);
                    auVar60[6] = -((char)bStack_92 < (char)bVar72);
                    auVar60[7] = -((char)bStack_91 < (char)bVar73);
                    auVar60[8] = -((char)bStack_90 < (char)bVar74);
                    auVar60[9] = -((char)bStack_8f < (char)bVar75);
                    auVar60[10] = -((char)bStack_8e < (char)bVar76);
                    auVar60[0xb] = -((char)bStack_8d < (char)bVar77);
                    auVar60[0xc] = -((char)bStack_8c < (char)bVar78);
                    auVar60[0xd] = -((char)bStack_8b < (char)bVar79);
                    auVar60[0xe] = -((char)bStack_8a < (char)bVar80);
                    auVar60[0xf] = -((char)bStack_89 < (char)bVar81);
                    auVar60 = auVar60 | auVar59;
                    if ((((((((((((((((auVar60 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar60 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar60 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar60 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar60 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar60 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar60 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar60 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar60 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar60 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar60 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar60 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar60 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar60 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar60 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar60[0xf]) {
                      cVar64 = alVar41[1]._7_1_;
                    }
                    else {
                      *(byte *)&ppVar26->flag = (byte)ppVar26->flag | 0x40;
                      cVar64 = '\0';
                      iVar24 = 0;
                      uVar33 = 0;
                    }
                    ppVar26->score = (int)cVar64;
                    ppVar26->end_query = uVar33;
                    ppVar26->end_ref = iVar24;
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(local_150);
                    parasail_free(ptr_01);
                    return ppVar26;
                  }
                  uVar32 = ptr_01[iVar25 - 1][0];
                  auVar62._8_8_ = ptr_01[iVar25 - 1][1] << 8 | uVar32 >> 0x38;
                  iVar31 = ppVar5->mapper[(byte)s2[uVar34]];
                  auVar62._0_8_ = uVar32 << 8 | (ulong)(byte)ptr_00[uVar34];
                  lVar30 = 0;
                  auVar63 = auVar61;
                  for (uVar32 = 0; size != uVar32; uVar32 = uVar32 + 1) {
                    auVar98 = paddsb(auVar62,*(undefined1 (*) [16])
                                              ((long)pvVar4 +
                                              lVar30 + (long)(iVar31 * iVar25) * 0x10));
                    pauVar2 = (undefined1 (*) [16])((long)*ptr + lVar30);
                    cVar99 = (*pauVar2)[0];
                    cVar100 = (*pauVar2)[1];
                    cVar101 = (*pauVar2)[2];
                    cVar102 = (*pauVar2)[3];
                    cVar103 = (*pauVar2)[4];
                    cVar104 = (*pauVar2)[5];
                    cVar105 = (*pauVar2)[6];
                    cVar106 = (*pauVar2)[7];
                    cVar107 = (*pauVar2)[8];
                    cVar108 = (*pauVar2)[9];
                    cVar109 = (*pauVar2)[10];
                    cVar110 = (*pauVar2)[0xb];
                    cVar111 = (*pauVar2)[0xc];
                    cVar112 = (*pauVar2)[0xd];
                    cVar113 = (*pauVar2)[0xe];
                    cVar21 = (*pauVar2)[0xf];
                    auVar62 = *pauVar2;
                    cVar64 = auVar63[0];
                    bVar39 = (cVar99 < cVar64) * cVar64 | (cVar99 >= cVar64) * cVar99;
                    cVar7 = auVar63[1];
                    bVar42 = (cVar100 < cVar7) * cVar7 | (cVar100 >= cVar7) * cVar100;
                    cVar8 = auVar63[2];
                    bVar43 = (cVar101 < cVar8) * cVar8 | (cVar101 >= cVar8) * cVar101;
                    cVar9 = auVar63[3];
                    bVar44 = (cVar102 < cVar9) * cVar9 | (cVar102 >= cVar9) * cVar102;
                    cVar10 = auVar63[4];
                    bVar45 = (cVar103 < cVar10) * cVar10 | (cVar103 >= cVar10) * cVar103;
                    cVar11 = auVar63[5];
                    bVar46 = (cVar104 < cVar11) * cVar11 | (cVar104 >= cVar11) * cVar104;
                    cVar12 = auVar63[6];
                    bVar47 = (cVar105 < cVar12) * cVar12 | (cVar105 >= cVar12) * cVar105;
                    cVar13 = auVar63[7];
                    bVar48 = (cVar106 < cVar13) * cVar13 | (cVar106 >= cVar13) * cVar106;
                    cVar14 = auVar63[8];
                    bVar49 = (cVar107 < cVar14) * cVar14 | (cVar107 >= cVar14) * cVar107;
                    cVar15 = auVar63[9];
                    bVar50 = (cVar108 < cVar15) * cVar15 | (cVar108 >= cVar15) * cVar108;
                    cVar16 = auVar63[10];
                    bVar51 = (cVar109 < cVar16) * cVar16 | (cVar109 >= cVar16) * cVar109;
                    cVar17 = auVar63[0xb];
                    bVar52 = (cVar110 < cVar17) * cVar17 | (cVar110 >= cVar17) * cVar110;
                    cVar18 = auVar63[0xc];
                    bVar53 = (cVar111 < cVar18) * cVar18 | (cVar111 >= cVar18) * cVar111;
                    cVar19 = auVar63[0xd];
                    bVar54 = (cVar112 < cVar19) * cVar19 | (cVar112 >= cVar19) * cVar112;
                    cVar20 = auVar63[0xe];
                    bVar55 = (cVar113 < cVar20) * cVar20 | (cVar113 >= cVar20) * cVar113;
                    cVar57 = auVar63[0xf];
                    bVar56 = (cVar21 < cVar57) * cVar57 | (cVar21 >= cVar57) * cVar21;
                    cVar65 = auVar98[0];
                    bVar39 = ((char)bVar39 < cVar65) * cVar65 | ((char)bVar39 >= cVar65) * bVar39;
                    cVar65 = auVar98[1];
                    bVar42 = ((char)bVar42 < cVar65) * cVar65 | ((char)bVar42 >= cVar65) * bVar42;
                    cVar65 = auVar98[2];
                    bVar43 = ((char)bVar43 < cVar65) * cVar65 | ((char)bVar43 >= cVar65) * bVar43;
                    cVar65 = auVar98[3];
                    bVar44 = ((char)bVar44 < cVar65) * cVar65 | ((char)bVar44 >= cVar65) * bVar44;
                    cVar65 = auVar98[4];
                    bVar45 = ((char)bVar45 < cVar65) * cVar65 | ((char)bVar45 >= cVar65) * bVar45;
                    cVar65 = auVar98[5];
                    bVar46 = ((char)bVar46 < cVar65) * cVar65 | ((char)bVar46 >= cVar65) * bVar46;
                    cVar65 = auVar98[6];
                    bVar47 = ((char)bVar47 < cVar65) * cVar65 | ((char)bVar47 >= cVar65) * bVar47;
                    cVar65 = auVar98[7];
                    bVar48 = ((char)bVar48 < cVar65) * cVar65 | ((char)bVar48 >= cVar65) * bVar48;
                    cVar65 = auVar98[8];
                    bVar49 = ((char)bVar49 < cVar65) * cVar65 | ((char)bVar49 >= cVar65) * bVar49;
                    cVar65 = auVar98[9];
                    bVar50 = ((char)bVar50 < cVar65) * cVar65 | ((char)bVar50 >= cVar65) * bVar50;
                    cVar65 = auVar98[10];
                    bVar51 = ((char)bVar51 < cVar65) * cVar65 | ((char)bVar51 >= cVar65) * bVar51;
                    cVar65 = auVar98[0xb];
                    bVar52 = ((char)bVar52 < cVar65) * cVar65 | ((char)bVar52 >= cVar65) * bVar52;
                    cVar65 = auVar98[0xc];
                    bVar53 = ((char)bVar53 < cVar65) * cVar65 | ((char)bVar53 >= cVar65) * bVar53;
                    cVar65 = auVar98[0xd];
                    bVar54 = ((char)bVar54 < cVar65) * cVar65 | ((char)bVar54 >= cVar65) * bVar54;
                    cVar65 = auVar98[0xe];
                    bVar55 = ((char)bVar55 < cVar65) * cVar65 | ((char)bVar55 >= cVar65) * bVar55;
                    cVar65 = auVar98[0xf];
                    bVar56 = ((char)bVar56 < cVar65) * cVar65 | ((char)bVar56 >= cVar65) * bVar56;
                    pbVar1 = (byte *)((long)*local_150 + lVar30);
                    *pbVar1 = bVar39;
                    pbVar1[1] = bVar42;
                    pbVar1[2] = bVar43;
                    pbVar1[3] = bVar44;
                    pbVar1[4] = bVar45;
                    pbVar1[5] = bVar46;
                    pbVar1[6] = bVar47;
                    pbVar1[7] = bVar48;
                    pbVar1[8] = bVar49;
                    pbVar1[9] = bVar50;
                    pbVar1[10] = bVar51;
                    pbVar1[0xb] = bVar52;
                    pbVar1[0xc] = bVar53;
                    pbVar1[0xd] = bVar54;
                    pbVar1[0xe] = bVar55;
                    pbVar1[0xf] = bVar56;
                    bVar66 = ((char)bVar66 < (char)bVar39) * bVar39 |
                             ((char)bVar66 >= (char)bVar39) * bVar66;
                    bVar67 = ((char)bVar67 < (char)bVar42) * bVar42 |
                             ((char)bVar67 >= (char)bVar42) * bVar67;
                    bVar68 = ((char)bVar68 < (char)bVar43) * bVar43 |
                             ((char)bVar68 >= (char)bVar43) * bVar68;
                    bVar69 = ((char)bVar69 < (char)bVar44) * bVar44 |
                             ((char)bVar69 >= (char)bVar44) * bVar69;
                    bVar70 = ((char)bVar70 < (char)bVar45) * bVar45 |
                             ((char)bVar70 >= (char)bVar45) * bVar70;
                    bVar71 = ((char)bVar71 < (char)bVar46) * bVar46 |
                             ((char)bVar71 >= (char)bVar46) * bVar71;
                    bVar72 = ((char)bVar72 < (char)bVar47) * bVar47 |
                             ((char)bVar72 >= (char)bVar47) * bVar72;
                    bVar73 = ((char)bVar73 < (char)bVar48) * bVar48 |
                             ((char)bVar73 >= (char)bVar48) * bVar73;
                    bVar74 = ((char)bVar74 < (char)bVar49) * bVar49 |
                             ((char)bVar74 >= (char)bVar49) * bVar74;
                    bVar75 = ((char)bVar75 < (char)bVar50) * bVar50 |
                             ((char)bVar75 >= (char)bVar50) * bVar75;
                    bVar76 = ((char)bVar76 < (char)bVar51) * bVar51 |
                             ((char)bVar76 >= (char)bVar51) * bVar76;
                    bVar77 = ((char)bVar77 < (char)bVar52) * bVar52 |
                             ((char)bVar77 >= (char)bVar52) * bVar77;
                    bVar78 = ((char)bVar78 < (char)bVar53) * bVar53 |
                             ((char)bVar78 >= (char)bVar53) * bVar78;
                    bVar79 = ((char)bVar79 < (char)bVar54) * bVar54 |
                             ((char)bVar79 >= (char)bVar54) * bVar79;
                    bVar80 = ((char)bVar80 < (char)bVar55) * bVar55 |
                             ((char)bVar80 >= (char)bVar55) * bVar80;
                    bVar81 = ((char)bVar81 < (char)bVar56) * bVar56 |
                             ((char)bVar81 >= (char)bVar56) * bVar81;
                    bVar82 = (cVar99 < (char)bVar82) * cVar99 | (cVar99 >= (char)bVar82) * bVar82;
                    bVar83 = (cVar100 < (char)bVar83) * cVar100 | (cVar100 >= (char)bVar83) * bVar83
                    ;
                    bVar84 = (cVar101 < (char)bVar84) * cVar101 | (cVar101 >= (char)bVar84) * bVar84
                    ;
                    bVar85 = (cVar102 < (char)bVar85) * cVar102 | (cVar102 >= (char)bVar85) * bVar85
                    ;
                    bVar86 = (cVar103 < (char)bVar86) * cVar103 | (cVar103 >= (char)bVar86) * bVar86
                    ;
                    bVar87 = (cVar104 < (char)bVar87) * cVar104 | (cVar104 >= (char)bVar87) * bVar87
                    ;
                    bVar88 = (cVar105 < (char)bVar88) * cVar105 | (cVar105 >= (char)bVar88) * bVar88
                    ;
                    bVar89 = (cVar106 < (char)bVar89) * cVar106 | (cVar106 >= (char)bVar89) * bVar89
                    ;
                    bVar90 = (cVar107 < (char)bVar90) * cVar107 | (cVar107 >= (char)bVar90) * bVar90
                    ;
                    bVar91 = (cVar108 < (char)bVar91) * cVar108 | (cVar108 >= (char)bVar91) * bVar91
                    ;
                    bVar92 = (cVar109 < (char)bVar92) * cVar109 | (cVar109 >= (char)bVar92) * bVar92
                    ;
                    bVar93 = (cVar110 < (char)bVar93) * cVar110 | (cVar110 >= (char)bVar93) * bVar93
                    ;
                    bVar94 = (cVar111 < (char)bVar94) * cVar111 | (cVar111 >= (char)bVar94) * bVar94
                    ;
                    bVar95 = (cVar112 < (char)bVar95) * cVar112 | (cVar112 >= (char)bVar95) * bVar95
                    ;
                    bVar96 = (cVar113 < (char)bVar96) * cVar113 | (cVar113 >= (char)bVar96) * bVar96
                    ;
                    bVar97 = (cVar21 < (char)bVar97) * cVar21 | (cVar21 >= (char)bVar97) * bVar97;
                    bVar82 = (cVar64 < (char)bVar82) * cVar64 | (cVar64 >= (char)bVar82) * bVar82;
                    bVar83 = (cVar7 < (char)bVar83) * cVar7 | (cVar7 >= (char)bVar83) * bVar83;
                    bVar84 = (cVar8 < (char)bVar84) * cVar8 | (cVar8 >= (char)bVar84) * bVar84;
                    bVar85 = (cVar9 < (char)bVar85) * cVar9 | (cVar9 >= (char)bVar85) * bVar85;
                    bVar86 = (cVar10 < (char)bVar86) * cVar10 | (cVar10 >= (char)bVar86) * bVar86;
                    bVar87 = (cVar11 < (char)bVar87) * cVar11 | (cVar11 >= (char)bVar87) * bVar87;
                    bVar88 = (cVar12 < (char)bVar88) * cVar12 | (cVar12 >= (char)bVar88) * bVar88;
                    bVar89 = (cVar13 < (char)bVar89) * cVar13 | (cVar13 >= (char)bVar89) * bVar89;
                    bVar90 = (cVar14 < (char)bVar90) * cVar14 | (cVar14 >= (char)bVar90) * bVar90;
                    bVar91 = (cVar15 < (char)bVar91) * cVar15 | (cVar15 >= (char)bVar91) * bVar91;
                    bVar92 = (cVar16 < (char)bVar92) * cVar16 | (cVar16 >= (char)bVar92) * bVar92;
                    bVar93 = (cVar17 < (char)bVar93) * cVar17 | (cVar17 >= (char)bVar93) * bVar93;
                    bVar94 = (cVar18 < (char)bVar94) * cVar18 | (cVar18 >= (char)bVar94) * bVar94;
                    bVar95 = (cVar19 < (char)bVar95) * cVar19 | (cVar19 >= (char)bVar95) * bVar95;
                    bVar96 = (cVar20 < (char)bVar96) * cVar20 | (cVar20 >= (char)bVar96) * bVar96;
                    bVar97 = (cVar57 < (char)bVar97) * cVar57 | (cVar57 >= (char)bVar97) * bVar97;
                    bVar82 = ((char)bVar39 < (char)bVar82) * bVar39 |
                             ((char)bVar39 >= (char)bVar82) * bVar82;
                    bVar83 = ((char)bVar42 < (char)bVar83) * bVar42 |
                             ((char)bVar42 >= (char)bVar83) * bVar83;
                    bVar84 = ((char)bVar43 < (char)bVar84) * bVar43 |
                             ((char)bVar43 >= (char)bVar84) * bVar84;
                    bVar85 = ((char)bVar44 < (char)bVar85) * bVar44 |
                             ((char)bVar44 >= (char)bVar85) * bVar85;
                    bVar86 = ((char)bVar45 < (char)bVar86) * bVar45 |
                             ((char)bVar45 >= (char)bVar86) * bVar86;
                    bVar87 = ((char)bVar46 < (char)bVar87) * bVar46 |
                             ((char)bVar46 >= (char)bVar87) * bVar87;
                    bVar88 = ((char)bVar47 < (char)bVar88) * bVar47 |
                             ((char)bVar47 >= (char)bVar88) * bVar88;
                    bVar89 = ((char)bVar48 < (char)bVar89) * bVar48 |
                             ((char)bVar48 >= (char)bVar89) * bVar89;
                    bVar90 = ((char)bVar49 < (char)bVar90) * bVar49 |
                             ((char)bVar49 >= (char)bVar90) * bVar90;
                    bVar91 = ((char)bVar50 < (char)bVar91) * bVar50 |
                             ((char)bVar50 >= (char)bVar91) * bVar91;
                    bVar92 = ((char)bVar51 < (char)bVar92) * bVar51 |
                             ((char)bVar51 >= (char)bVar92) * bVar92;
                    bVar93 = ((char)bVar52 < (char)bVar93) * bVar52 |
                             ((char)bVar52 >= (char)bVar93) * bVar93;
                    bVar94 = ((char)bVar53 < (char)bVar94) * bVar53 |
                             ((char)bVar53 >= (char)bVar94) * bVar94;
                    bVar95 = ((char)bVar54 < (char)bVar95) * bVar54 |
                             ((char)bVar54 >= (char)bVar95) * bVar95;
                    bVar96 = ((char)bVar55 < (char)bVar96) * bVar55 |
                             ((char)bVar55 >= (char)bVar96) * bVar96;
                    bVar97 = ((char)bVar56 < (char)bVar97) * bVar56 |
                             ((char)bVar56 >= (char)bVar97) * bVar97;
                    vH[0] = uVar32 & 0xffffffff;
                    vH[1] = size;
                    arr_store_si128(((ppVar26->field_4).rowcols)->score_row,vH,(int32_t)uVar34,s2Len
                                    ,iVar25,in_stack_fffffffffffffe98);
                    auVar98[1] = bVar42;
                    auVar98[0] = bVar39;
                    auVar98[2] = bVar43;
                    auVar98[3] = bVar44;
                    auVar98[4] = bVar45;
                    auVar98[5] = bVar46;
                    auVar98[6] = bVar47;
                    auVar98[7] = bVar48;
                    auVar98[8] = bVar49;
                    auVar98[9] = bVar50;
                    auVar98[10] = bVar51;
                    auVar98[0xb] = bVar52;
                    auVar98[0xc] = bVar53;
                    auVar98[0xd] = bVar54;
                    auVar98[0xe] = bVar55;
                    auVar98[0xf] = bVar56;
                    auVar98 = psubsb(auVar98,auVar59);
                    auVar62 = psubsb(auVar62,auVar60);
                    cVar64 = auVar98[0];
                    cVar57 = auVar62[0];
                    cVar65 = auVar98[1];
                    cVar99 = auVar62[1];
                    cVar7 = auVar98[2];
                    cVar100 = auVar62[2];
                    cVar8 = auVar98[3];
                    cVar101 = auVar62[3];
                    cVar9 = auVar98[4];
                    cVar102 = auVar62[4];
                    cVar10 = auVar98[5];
                    cVar103 = auVar62[5];
                    cVar11 = auVar98[6];
                    cVar104 = auVar62[6];
                    cVar12 = auVar98[7];
                    cVar105 = auVar62[7];
                    cVar13 = auVar98[8];
                    cVar106 = auVar62[8];
                    cVar14 = auVar98[9];
                    cVar107 = auVar62[9];
                    cVar15 = auVar98[10];
                    cVar108 = auVar62[10];
                    cVar16 = auVar98[0xb];
                    cVar109 = auVar62[0xb];
                    cVar17 = auVar98[0xc];
                    cVar110 = auVar62[0xc];
                    cVar18 = auVar98[0xd];
                    cVar111 = auVar62[0xd];
                    cVar19 = auVar98[0xe];
                    cVar112 = auVar62[0xe];
                    cVar113 = auVar62[0xf];
                    cVar20 = auVar98[0xf];
                    pbVar1 = (byte *)((long)*ptr + lVar30);
                    *pbVar1 = (cVar57 < cVar64) * cVar64 | (cVar57 >= cVar64) * cVar57;
                    pbVar1[1] = (cVar99 < cVar65) * cVar65 | (cVar99 >= cVar65) * cVar99;
                    pbVar1[2] = (cVar100 < cVar7) * cVar7 | (cVar100 >= cVar7) * cVar100;
                    pbVar1[3] = (cVar101 < cVar8) * cVar8 | (cVar101 >= cVar8) * cVar101;
                    pbVar1[4] = (cVar102 < cVar9) * cVar9 | (cVar102 >= cVar9) * cVar102;
                    pbVar1[5] = (cVar103 < cVar10) * cVar10 | (cVar103 >= cVar10) * cVar103;
                    pbVar1[6] = (cVar104 < cVar11) * cVar11 | (cVar104 >= cVar11) * cVar104;
                    pbVar1[7] = (cVar105 < cVar12) * cVar12 | (cVar105 >= cVar12) * cVar105;
                    pbVar1[8] = (cVar106 < cVar13) * cVar13 | (cVar106 >= cVar13) * cVar106;
                    pbVar1[9] = (cVar107 < cVar14) * cVar14 | (cVar107 >= cVar14) * cVar107;
                    pbVar1[10] = (cVar108 < cVar15) * cVar15 | (cVar108 >= cVar15) * cVar108;
                    pbVar1[0xb] = (cVar109 < cVar16) * cVar16 | (cVar109 >= cVar16) * cVar109;
                    pbVar1[0xc] = (cVar110 < cVar17) * cVar17 | (cVar110 >= cVar17) * cVar110;
                    pbVar1[0xd] = (cVar111 < cVar18) * cVar18 | (cVar111 >= cVar18) * cVar111;
                    pbVar1[0xe] = (cVar112 < cVar19) * cVar19 | (cVar112 >= cVar19) * cVar112;
                    pbVar1[0xf] = (cVar113 < cVar20) * cVar20 | (cVar113 >= cVar20) * cVar113;
                    auVar62 = psubsb(auVar63,auVar60);
                    cVar57 = auVar62[0];
                    auVar63[0] = (cVar57 < cVar64) * cVar64 | (cVar57 >= cVar64) * cVar57;
                    cVar64 = auVar62[1];
                    auVar63[1] = (cVar64 < cVar65) * cVar65 | (cVar64 >= cVar65) * cVar64;
                    cVar64 = auVar62[2];
                    auVar63[2] = (cVar64 < cVar7) * cVar7 | (cVar64 >= cVar7) * cVar64;
                    cVar64 = auVar62[3];
                    auVar63[3] = (cVar64 < cVar8) * cVar8 | (cVar64 >= cVar8) * cVar64;
                    cVar64 = auVar62[4];
                    auVar63[4] = (cVar64 < cVar9) * cVar9 | (cVar64 >= cVar9) * cVar64;
                    cVar64 = auVar62[5];
                    auVar63[5] = (cVar64 < cVar10) * cVar10 | (cVar64 >= cVar10) * cVar64;
                    cVar64 = auVar62[6];
                    auVar63[6] = (cVar64 < cVar11) * cVar11 | (cVar64 >= cVar11) * cVar64;
                    cVar64 = auVar62[7];
                    auVar63[7] = (cVar64 < cVar12) * cVar12 | (cVar64 >= cVar12) * cVar64;
                    cVar64 = auVar62[8];
                    auVar63[8] = (cVar64 < cVar13) * cVar13 | (cVar64 >= cVar13) * cVar64;
                    cVar64 = auVar62[9];
                    auVar63[9] = (cVar64 < cVar14) * cVar14 | (cVar64 >= cVar14) * cVar64;
                    cVar64 = auVar62[10];
                    auVar63[10] = (cVar64 < cVar15) * cVar15 | (cVar64 >= cVar15) * cVar64;
                    cVar64 = auVar62[0xb];
                    auVar63[0xb] = (cVar64 < cVar16) * cVar16 | (cVar64 >= cVar16) * cVar64;
                    cVar64 = auVar62[0xc];
                    auVar63[0xc] = (cVar64 < cVar17) * cVar17 | (cVar64 >= cVar17) * cVar64;
                    cVar64 = auVar62[0xd];
                    auVar63[0xd] = (cVar64 < cVar18) * cVar18 | (cVar64 >= cVar18) * cVar64;
                    cVar64 = auVar62[0xe];
                    cVar65 = auVar62[0xf];
                    auVar63[0xe] = (cVar64 < cVar19) * cVar19 | (cVar64 >= cVar19) * cVar64;
                    auVar63[0xf] = (cVar65 < cVar20) * cVar20 | (cVar65 >= cVar20) * cVar65;
                    auVar62 = *(undefined1 (*) [16])((long)*ptr_01 + lVar30);
                    lVar30 = lVar30 + 0x10;
                  }
                  for (iVar31 = 0; iVar31 != 0x10; iVar31 = iVar31 + 1) {
                    uVar32 = (ulong)(uint)(ptr_00[uVar34 + 1] - open);
                    if (ptr_00[uVar34 + 1] - open < -0x7f) {
                      uVar32 = 0xffffff80;
                    }
                    uVar58 = auVar63._0_8_;
                    auVar63._8_8_ = auVar63._8_8_ << 8 | uVar58 >> 0x38;
                    auVar63._0_8_ = uVar58 << 8 | uVar32 & 0xff;
                    uVar32 = 0;
                    palVar27 = local_150;
                    while (size != uVar32) {
                      cVar65 = (char)(*palVar27)[0];
                      cVar7 = *(char *)((long)*palVar27 + 1);
                      cVar8 = *(char *)((long)*palVar27 + 2);
                      cVar9 = *(char *)((long)*palVar27 + 3);
                      cVar10 = *(char *)((long)*palVar27 + 4);
                      cVar11 = *(char *)((long)*palVar27 + 5);
                      cVar12 = *(char *)((long)*palVar27 + 6);
                      cVar13 = *(char *)((long)*palVar27 + 7);
                      cVar14 = (char)(*palVar27)[1];
                      cVar15 = *(char *)((long)*palVar27 + 9);
                      cVar16 = *(char *)((long)*palVar27 + 10);
                      cVar17 = *(char *)((long)*palVar27 + 0xb);
                      cVar18 = *(char *)((long)*palVar27 + 0xc);
                      cVar19 = *(char *)((long)*palVar27 + 0xd);
                      cVar20 = *(char *)((long)*palVar27 + 0xe);
                      cVar57 = *(char *)((long)*palVar27 + 0xf);
                      cVar64 = auVar63[0];
                      bVar39 = (cVar65 < cVar64) * cVar64 | (cVar65 >= cVar64) * cVar65;
                      cVar64 = auVar63[1];
                      bVar42 = (cVar7 < cVar64) * cVar64 | (cVar7 >= cVar64) * cVar7;
                      cVar64 = auVar63[2];
                      bVar43 = (cVar8 < cVar64) * cVar64 | (cVar8 >= cVar64) * cVar8;
                      cVar64 = auVar63[3];
                      bVar44 = (cVar9 < cVar64) * cVar64 | (cVar9 >= cVar64) * cVar9;
                      cVar64 = auVar63[4];
                      bVar45 = (cVar10 < cVar64) * cVar64 | (cVar10 >= cVar64) * cVar10;
                      cVar64 = auVar63[5];
                      bVar46 = (cVar11 < cVar64) * cVar64 | (cVar11 >= cVar64) * cVar11;
                      cVar64 = auVar63[6];
                      bVar47 = (cVar12 < cVar64) * cVar64 | (cVar12 >= cVar64) * cVar12;
                      cVar64 = auVar63[7];
                      bVar48 = (cVar13 < cVar64) * cVar64 | (cVar13 >= cVar64) * cVar13;
                      cVar64 = auVar63[8];
                      bVar49 = (cVar14 < cVar64) * cVar64 | (cVar14 >= cVar64) * cVar14;
                      cVar64 = auVar63[9];
                      bVar50 = (cVar15 < cVar64) * cVar64 | (cVar15 >= cVar64) * cVar15;
                      cVar64 = auVar63[10];
                      bVar51 = (cVar16 < cVar64) * cVar64 | (cVar16 >= cVar64) * cVar16;
                      cVar64 = auVar63[0xb];
                      bVar52 = (cVar17 < cVar64) * cVar64 | (cVar17 >= cVar64) * cVar17;
                      cVar64 = auVar63[0xc];
                      bVar53 = (cVar18 < cVar64) * cVar64 | (cVar18 >= cVar64) * cVar18;
                      cVar64 = auVar63[0xd];
                      bVar54 = (cVar19 < cVar64) * cVar64 | (cVar19 >= cVar64) * cVar19;
                      cVar64 = auVar63[0xe];
                      bVar55 = (cVar20 < cVar64) * cVar64 | (cVar20 >= cVar64) * cVar20;
                      cVar64 = auVar63[0xf];
                      bVar56 = (cVar57 < cVar64) * cVar64 | (cVar57 >= cVar64) * cVar57;
                      *(byte *)*palVar27 = bVar39;
                      *(byte *)((long)*palVar27 + 1) = bVar42;
                      *(byte *)((long)*palVar27 + 2) = bVar43;
                      *(byte *)((long)*palVar27 + 3) = bVar44;
                      *(byte *)((long)*palVar27 + 4) = bVar45;
                      *(byte *)((long)*palVar27 + 5) = bVar46;
                      *(byte *)((long)*palVar27 + 6) = bVar47;
                      *(byte *)((long)*palVar27 + 7) = bVar48;
                      *(byte *)(*palVar27 + 1) = bVar49;
                      *(byte *)((long)*palVar27 + 9) = bVar50;
                      *(byte *)((long)*palVar27 + 10) = bVar51;
                      *(byte *)((long)*palVar27 + 0xb) = bVar52;
                      *(byte *)((long)*palVar27 + 0xc) = bVar53;
                      *(byte *)((long)*palVar27 + 0xd) = bVar54;
                      *(byte *)((long)*palVar27 + 0xe) = bVar55;
                      *(byte *)((long)*palVar27 + 0xf) = bVar56;
                      bVar82 = ((char)bVar39 < (char)bVar82) * bVar39 |
                               ((char)bVar39 >= (char)bVar82) * bVar82;
                      bVar83 = ((char)bVar42 < (char)bVar83) * bVar42 |
                               ((char)bVar42 >= (char)bVar83) * bVar83;
                      bVar84 = ((char)bVar43 < (char)bVar84) * bVar43 |
                               ((char)bVar43 >= (char)bVar84) * bVar84;
                      bVar85 = ((char)bVar44 < (char)bVar85) * bVar44 |
                               ((char)bVar44 >= (char)bVar85) * bVar85;
                      bVar86 = ((char)bVar45 < (char)bVar86) * bVar45 |
                               ((char)bVar45 >= (char)bVar86) * bVar86;
                      bVar87 = ((char)bVar46 < (char)bVar87) * bVar46 |
                               ((char)bVar46 >= (char)bVar87) * bVar87;
                      bVar88 = ((char)bVar47 < (char)bVar88) * bVar47 |
                               ((char)bVar47 >= (char)bVar88) * bVar88;
                      bVar89 = ((char)bVar48 < (char)bVar89) * bVar48 |
                               ((char)bVar48 >= (char)bVar89) * bVar89;
                      bVar90 = ((char)bVar49 < (char)bVar90) * bVar49 |
                               ((char)bVar49 >= (char)bVar90) * bVar90;
                      bVar91 = ((char)bVar50 < (char)bVar91) * bVar50 |
                               ((char)bVar50 >= (char)bVar91) * bVar91;
                      bVar92 = ((char)bVar51 < (char)bVar92) * bVar51 |
                               ((char)bVar51 >= (char)bVar92) * bVar92;
                      bVar93 = ((char)bVar52 < (char)bVar93) * bVar52 |
                               ((char)bVar52 >= (char)bVar93) * bVar93;
                      bVar94 = ((char)bVar53 < (char)bVar94) * bVar53 |
                               ((char)bVar53 >= (char)bVar94) * bVar94;
                      bVar95 = ((char)bVar54 < (char)bVar95) * bVar54 |
                               ((char)bVar54 >= (char)bVar95) * bVar95;
                      bVar96 = ((char)bVar55 < (char)bVar96) * bVar55 |
                               ((char)bVar55 >= (char)bVar96) * bVar96;
                      bVar97 = ((char)bVar56 < (char)bVar97) * bVar56 |
                               ((char)bVar56 >= (char)bVar97) * bVar97;
                      bVar66 = ((char)bVar66 < (char)bVar39) * bVar39 |
                               ((char)bVar66 >= (char)bVar39) * bVar66;
                      bVar67 = ((char)bVar67 < (char)bVar42) * bVar42 |
                               ((char)bVar67 >= (char)bVar42) * bVar67;
                      bVar68 = ((char)bVar68 < (char)bVar43) * bVar43 |
                               ((char)bVar68 >= (char)bVar43) * bVar68;
                      bVar69 = ((char)bVar69 < (char)bVar44) * bVar44 |
                               ((char)bVar69 >= (char)bVar44) * bVar69;
                      bVar70 = ((char)bVar70 < (char)bVar45) * bVar45 |
                               ((char)bVar70 >= (char)bVar45) * bVar70;
                      bVar71 = ((char)bVar71 < (char)bVar46) * bVar46 |
                               ((char)bVar71 >= (char)bVar46) * bVar71;
                      bVar72 = ((char)bVar72 < (char)bVar47) * bVar47 |
                               ((char)bVar72 >= (char)bVar47) * bVar72;
                      bVar73 = ((char)bVar73 < (char)bVar48) * bVar48 |
                               ((char)bVar73 >= (char)bVar48) * bVar73;
                      bVar74 = ((char)bVar74 < (char)bVar49) * bVar49 |
                               ((char)bVar74 >= (char)bVar49) * bVar74;
                      bVar75 = ((char)bVar75 < (char)bVar50) * bVar50 |
                               ((char)bVar75 >= (char)bVar50) * bVar75;
                      bVar76 = ((char)bVar76 < (char)bVar51) * bVar51 |
                               ((char)bVar76 >= (char)bVar51) * bVar76;
                      bVar77 = ((char)bVar77 < (char)bVar52) * bVar52 |
                               ((char)bVar77 >= (char)bVar52) * bVar77;
                      bVar78 = ((char)bVar78 < (char)bVar53) * bVar53 |
                               ((char)bVar78 >= (char)bVar53) * bVar78;
                      bVar79 = ((char)bVar79 < (char)bVar54) * bVar54 |
                               ((char)bVar79 >= (char)bVar54) * bVar79;
                      bVar80 = ((char)bVar80 < (char)bVar55) * bVar55 |
                               ((char)bVar80 >= (char)bVar55) * bVar80;
                      bVar81 = ((char)bVar81 < (char)bVar56) * bVar56 |
                               ((char)bVar81 >= (char)bVar56) * bVar81;
                      vH_00[0] = uVar32 & 0xffffffff;
                      vH_00[1] = size;
                      arr_store_si128(((ppVar26->field_4).rowcols)->score_row,vH_00,(int32_t)uVar34,
                                      s2Len,iVar25,in_stack_fffffffffffffe98);
                      auVar22[1] = bVar42;
                      auVar22[0] = bVar39;
                      auVar22[2] = bVar43;
                      auVar22[3] = bVar44;
                      auVar22[4] = bVar45;
                      auVar22[5] = bVar46;
                      auVar22[6] = bVar47;
                      auVar22[7] = bVar48;
                      auVar22[8] = bVar49;
                      auVar22[9] = bVar50;
                      auVar22[10] = bVar51;
                      auVar22[0xb] = bVar52;
                      auVar22[0xc] = bVar53;
                      auVar22[0xd] = bVar54;
                      auVar22[0xe] = bVar55;
                      auVar22[0xf] = bVar56;
                      auVar62 = psubsb(auVar22,auVar59);
                      auVar63 = psubsb(auVar63,auVar60);
                      auVar40[0] = -(auVar62[0] < auVar63[0]);
                      auVar40[1] = -(auVar62[1] < auVar63[1]);
                      auVar40[2] = -(auVar62[2] < auVar63[2]);
                      auVar40[3] = -(auVar62[3] < auVar63[3]);
                      auVar40[4] = -(auVar62[4] < auVar63[4]);
                      auVar40[5] = -(auVar62[5] < auVar63[5]);
                      auVar40[6] = -(auVar62[6] < auVar63[6]);
                      auVar40[7] = -(auVar62[7] < auVar63[7]);
                      auVar40[8] = -(auVar62[8] < auVar63[8]);
                      auVar40[9] = -(auVar62[9] < auVar63[9]);
                      auVar40[10] = -(auVar62[10] < auVar63[10]);
                      auVar40[0xb] = -(auVar62[0xb] < auVar63[0xb]);
                      auVar40[0xc] = -(auVar62[0xc] < auVar63[0xc]);
                      auVar40[0xd] = -(auVar62[0xd] < auVar63[0xd]);
                      auVar40[0xe] = -(auVar62[0xe] < auVar63[0xe]);
                      bVar6 = auVar62[0xf] < auVar63[0xf];
                      auVar40[0xf] = -bVar6;
                      uVar32 = uVar32 + 1;
                      palVar27 = palVar27 + 1;
                      if ((((((((((((((((auVar40 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar40 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar40 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar40 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar40 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar40 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar40 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar40 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar40 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar40 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar40 >> 0x57 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar40 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar40 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar40 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar40 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          !bVar6) goto LAB_0066c4da;
                    }
                  }
LAB_0066c4da:
                  uVar34 = uVar34 + 1;
                  palVar27 = local_150;
                  local_150 = ptr_01;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar29 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_table_striped_profile_sse41_128_8",pcVar29);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile8.score;
    vGapO = _mm_set1_epi8(open);
    vGapE = _mm_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad  = parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int8_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_8_t h;
            __m128i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 1);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi8(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi8(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi8(vH, vE);
            vH = _mm_max_epi8(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi8(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi8(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi8(vH, vGapO);
            vE = _mm_subs_epi8(vE, vGapE);
            vE = _mm_max_epi8(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi8(vF, vGapE);
            vF = _mm_max_epi8(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int8_t tmp2 = tmp < INT8_MIN ? INT8_MIN : tmp;
            vF = _mm_slli_si128(vF, 1);
            vF = _mm_insert_epi8(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi8(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi8(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi8(vH, vGapO);
                vF = _mm_subs_epi8(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm_max_epi8(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm_extract_epi8 (vH, 15);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 1);
        }
        score = (int8_t) _mm_extract_epi8 (vH, 15);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}